

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intraprocess_publisher_link.cpp
# Opt level: O0

void __thiscall miniros::IntraProcessPublisherLink::drop(IntraProcessPublisherLink *this)

{
  element_type *peVar1;
  element_type *this_00;
  undefined8 uVar2;
  char *in_RDI;
  bool bVar3;
  bool enabled;
  SubscriptionPtr parent;
  scoped_lock<std::recursive_mutex> lock;
  char *in_stack_ffffffffffffff48;
  LogLocation *in_stack_ffffffffffffff50;
  weak_ptr<miniros::Subscription> *in_stack_ffffffffffffff58;
  LogLocation *in_stack_ffffffffffffff60;
  void *logger_handle;
  undefined8 in_stack_ffffffffffffff70;
  Level LVar4;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  LogLocation *loc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  LogLocation local_59;
  PublisherLinkPtr *in_stack_ffffffffffffffb8;
  Subscription *in_stack_ffffffffffffffc0;
  __shared_ptr local_28 [20];
  uint local_14;
  
  LVar4 = (Level)((ulong)in_stack_ffffffffffffff70 >> 0x20);
  std::scoped_lock<std::recursive_mutex>::scoped_lock
            ((scoped_lock<std::recursive_mutex> *)in_stack_ffffffffffffff50,
             (mutex_type *)in_stack_ffffffffffffff48);
  bVar3 = (in_RDI[0x118] & 1U) == 0;
  if (bVar3) {
    in_RDI[0x118] = '\x01';
  }
  local_14 = (uint)!bVar3;
  std::scoped_lock<std::recursive_mutex>::~scoped_lock
            ((scoped_lock<std::recursive_mutex> *)0x452fdf);
  if (local_14 == 0) {
    bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x108));
    if (bVar3) {
      peVar1 = std::
               __shared_ptr_access<miniros::IntraProcessSubscriberLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<miniros::IntraProcessSubscriberLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x453019);
      (*(peVar1->super_SubscriberLink)._vptr_SubscriberLink[3])();
      std::__shared_ptr<miniros::IntraProcessSubscriberLink,_(__gnu_cxx::_Lock_policy)2>::reset
                ((__shared_ptr<miniros::IntraProcessSubscriberLink,_(__gnu_cxx::_Lock_policy)2> *)
                 in_stack_ffffffffffffff60);
    }
    std::weak_ptr<miniros::Subscription>::lock(in_stack_ffffffffffffff58);
    bVar3 = std::__shared_ptr::operator_cast_to_bool(local_28);
    if (bVar3) {
      if (((console::g_initialized ^ 0xff) & 1) != 0) {
        console::initialize();
      }
      if (((drop::loc.initialized_ ^ 0xffU) & 1) != 0) {
        loc = &local_59;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffff90,in_RDI,(allocator<char> *)loc);
        console::initializeLogLocation
                  (loc,(string *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),LVar4
                  );
        std::__cxx11::string::~string((string *)&local_59.logger_enabled_);
        std::allocator<char>::~allocator((allocator<char> *)&local_59);
      }
      if (drop::loc.level_ != Debug) {
        console::setLogLocationLevel
                  (in_stack_ffffffffffffff50,(Level)((ulong)in_stack_ffffffffffffff48 >> 0x20));
        console::checkLogLocationEnabled(in_stack_ffffffffffffff60);
      }
      LVar4 = drop::loc.level_;
      if ((drop::loc.logger_enabled_ & 1U) != 0) {
        logger_handle = drop::loc.logger_;
        this_00 = std::
                  __shared_ptr_access<miniros::Subscription,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<miniros::Subscription,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x4531b4);
        Subscription::getName_abi_cxx11_(this_00);
        uVar2 = std::__cxx11::string::c_str();
        in_stack_ffffffffffffff48 = "Connection to local publisher on topic [%s] dropped";
        console::print((FilterBase *)0x0,logger_handle,(Level)(ulong)LVar4,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/intraprocess_publisher_link.cpp"
                       ,0x65,"virtual void miniros::IntraProcessPublisherLink::drop()",
                       "Connection to local publisher on topic [%s] dropped",uVar2);
      }
      std::__shared_ptr_access<miniros::Subscription,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<miniros::Subscription,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x45321c);
      std::enable_shared_from_this<miniros::PublisherLink>::shared_from_this
                ((enable_shared_from_this<miniros::PublisherLink> *)in_stack_ffffffffffffff48);
      Subscription::removePublisherLink(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      std::shared_ptr<miniros::PublisherLink>::~shared_ptr
                ((shared_ptr<miniros::PublisherLink> *)0x453251);
    }
    std::shared_ptr<miniros::Subscription>::~shared_ptr
              ((shared_ptr<miniros::Subscription> *)0x453280);
  }
  return;
}

Assistant:

void IntraProcessPublisherLink::drop()
{
  {
    std::scoped_lock<std::recursive_mutex> lock(drop_mutex_);
    if (dropped_)
    {
      return;
    }

    dropped_ = true;
  }

  if (publisher_)
  {
    publisher_->drop();
    publisher_.reset();
  }

  if (SubscriptionPtr parent = parent_.lock())
  {
    MINIROS_DEBUG("Connection to local publisher on topic [%s] dropped", parent->getName().c_str());

    parent->removePublisherLink(shared_from_this());
  }
}